

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O1

void __thiscall
ObserverManager_TwoProtocolsSubscribe_Test::TestBody
          (ObserverManager_TwoProtocolsSubscribe_Test *this)

{
  bool bVar1;
  B *this_00;
  char *message;
  AssertionResult gtest_ar;
  stringstream out;
  AssertHelper local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  internal local_1a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = (B *)operator_new(0x28);
  B::B(this_00,local_188);
  ObserverManager::subscribe<TicTacProtocol,B>(this_00);
  ObserverManager::subscribe<FooBarProtocol,B>(this_00);
  ObserverManager::notify<TicTacProtocol>((ObserverManager *)0x11,0);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Toe");
  (*(this_00->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])
            (this_00);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            (local_1a8,"\"Tic Tac Toe \"","out.str()",(char (*) [13])"Tic Tac Toe ",&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_1a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
      }
      local_1c8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsSubscribe) {
    std::stringstream out;

    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    delete b;

    EXPECT_EQ("Tic Tac Toe ", out.str());
}